

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_sint64 doBufferedRead(FileHandle *fh,void *_buffer,size_t len)

{
  size_t sVar1;
  PHYSFS_uint8 *local_58;
  PHYSFS_sint64 rc;
  PHYSFS_Io *io;
  size_t cpy;
  size_t avail;
  PHYSFS_sint64 retval;
  PHYSFS_uint8 *buffer;
  size_t len_local;
  void *_buffer_local;
  FileHandle *fh_local;
  
  avail = 0;
  retval = (PHYSFS_sint64)_buffer;
  buffer = (PHYSFS_uint8 *)len;
  while( true ) {
    while( true ) {
      if (buffer == (PHYSFS_uint8 *)0x0) {
        return avail;
      }
      local_58 = (PHYSFS_uint8 *)(fh->buffill - fh->bufpos);
      if (local_58 != (PHYSFS_uint8 *)0x0) break;
      sVar1 = (*fh->io->read)(fh->io,fh->buffer,fh->bufsize);
      fh->bufpos = 0;
      if ((long)sVar1 < 1) {
        fh->buffill = 0;
        if (avail != 0) {
          return avail;
        }
        return sVar1;
      }
      fh->buffill = sVar1;
    }
    if (buffer < local_58) {
      local_58 = buffer;
    }
    memcpy((void *)retval,fh->buffer + fh->bufpos,(size_t)local_58);
    if (buffer < local_58) break;
    retval = (PHYSFS_sint64)(local_58 + retval);
    buffer = buffer + -(long)local_58;
    fh->bufpos = (size_t)(local_58 + fh->bufpos);
    avail = (size_t)(local_58 + avail);
  }
  __assert_fail("len >= cpy",
                "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                ,0xb22,"PHYSFS_sint64 doBufferedRead(FileHandle *, void *, size_t)");
}

Assistant:

static PHYSFS_sint64 doBufferedRead(FileHandle *fh, void *_buffer, size_t len)
{
    PHYSFS_uint8 *buffer = (PHYSFS_uint8 *) _buffer;
    PHYSFS_sint64 retval = 0;

    while (len > 0)
    {
        const size_t avail = fh->buffill - fh->bufpos;
        if (avail > 0)  /* data available in the buffer. */
        {
            const size_t cpy = (len < avail) ? len : avail;
            memcpy(buffer, fh->buffer + fh->bufpos, cpy);
            assert(len >= cpy);
            buffer += cpy;
            len -= cpy;
            fh->bufpos += cpy;
            retval += cpy;
        } /* if */

        else   /* buffer is empty, refill it. */
        {
            PHYSFS_Io *io = fh->io;
            const PHYSFS_sint64 rc = io->read(io, fh->buffer, fh->bufsize);
            fh->bufpos = 0;
            if (rc > 0)
                fh->buffill = (size_t) rc;
            else
            {
                fh->buffill = 0;
                if (retval == 0)  /* report already-read data, or failure. */
                    retval = rc;
                break;
            } /* else */
        } /* else */
    } /* while */

    return retval;
}